

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkAddDummyPoNames(Abc_Ntk_t *pNtk)

{
  uint n;
  int nDigits_00;
  int iVar1;
  Abc_Obj_t *pObj_00;
  char *pName;
  int local_20;
  int i;
  int nDigits;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  n = Abc_NtkPoNum(pNtk);
  nDigits_00 = Abc_Base10Log(n);
  for (local_20 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_20 < iVar1; local_20 = local_20 + 1) {
    pObj_00 = Abc_NtkPo(pNtk,local_20);
    pName = Abc_ObjNameDummy("po",local_20,nDigits_00);
    Abc_ObjAssignName(pObj_00,pName,(char *)0x0);
  }
  return;
}

Assistant:

void Abc_NtkAddDummyPoNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nDigits, i;
    nDigits = Abc_Base10Log( Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("po", i, nDigits), NULL );
}